

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O0

void Fra_ClauMinimizeClause(Cla_Man_t *p,Vec_Int_t *vBasis,Vec_Int_t *vExtra)

{
  int iVar1;
  undefined4 local_30;
  undefined4 local_2c;
  int k;
  int i;
  int iLit2;
  int iLit;
  Vec_Int_t *vExtra_local;
  Vec_Int_t *vBasis_local;
  Cla_Man_t *p_local;
  
  local_2c = Vec_IntSize(vExtra);
  while (local_2c = local_2c + -1, -1 < local_2c) {
    Vec_IntEntry(vExtra,local_2c);
    Vec_IntClear(vBasis);
    for (local_30 = 0; iVar1 = Vec_IntSize(vExtra), local_30 < iVar1; local_30 = local_30 + 1) {
      iVar1 = Vec_IntEntry(vExtra,local_30);
      if (local_30 != local_2c) {
        Vec_IntPush(vBasis,iVar1);
      }
    }
    iVar1 = Fra_ClauCheckClause(p,vBasis,(Vec_Int_t *)0x0);
    if (iVar1 != 0) {
      for (local_30 = local_2c; iVar1 = Vec_IntSize(vExtra), local_30 < iVar1 + -1;
          local_30 = local_30 + 1) {
        iVar1 = Vec_IntEntry(vExtra,local_30 + 1);
        Vec_IntWriteEntry(vExtra,local_30,iVar1);
      }
      iVar1 = Vec_IntSize(vExtra);
      Vec_IntShrink(vExtra,iVar1 + -1);
    }
  }
  return;
}

Assistant:

void Fra_ClauMinimizeClause( Cla_Man_t * p, Vec_Int_t * vBasis, Vec_Int_t * vExtra )
{
    int iLit, iLit2, i, k;
    Vec_IntForEachEntryReverse( vExtra, iLit, i )
    {
        // copy literals without the given one
        Vec_IntClear( vBasis );
        Vec_IntForEachEntry( vExtra, iLit2, k )
            if ( k != i )
                Vec_IntPush( vBasis, iLit2 );
        // try whether it is inductive
        if ( !Fra_ClauCheckClause( p, vBasis, NULL ) )
            continue;
        // the clause is inductive
        // remove the literal
        for ( k = i; k < Vec_IntSize(vExtra)-1; k++ )
            Vec_IntWriteEntry( vExtra, k, Vec_IntEntry(vExtra,k+1) );
        Vec_IntShrink( vExtra, Vec_IntSize(vExtra)-1 );
    }
}